

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O2

bool __thiscall assembler::SessionPDU::completeHeader(SessionPDU *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *b;
  HeaderMap *this_00;
  size_t sVar1;
  SZ_com_t_s *pSVar2;
  bool bVar3;
  RiceCompressionHeader RVar4;
  pointer __p;
  ImageStructureHeader IVar5;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  b = &this->buf_;
  lrit::getHeaderMap((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &local_60,b);
  this_00 = &this->m_;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&this_00->_M_t,&local_60);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  sVar1 = (this->m_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((sVar1 != 0) && ((this->ph_).fileType == '\0')) {
    IVar5 = lrit::getHeader<lrit::ImageStructureHeader>(b,this_00);
    if ((IVar5._8_4_ & 0xff0000) == 0x10000) {
      bVar3 = lrit::hasHeader<lrit::RiceCompressionHeader>(this_00);
      if (bVar3) {
        RVar4 = lrit::getHeader<lrit::RiceCompressionHeader>(b,this_00);
        __p = (pointer)operator_new(0x10);
        std::__uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::reset
                  ((__uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)&this->szParam_,
                   __p);
        pSVar2 = (this->szParam_)._M_t.
                 super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>._M_t.
                 super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
                 super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl;
        pSVar2->options_mask = RVar4._4_4_ & 0xffff | 0x80;
        pSVar2->bits_per_pixel = IVar5._4_4_ & 0xff;
        pSVar2->pixels_per_block = RVar4._6_2_ & 0xff;
        pSVar2->pixels_per_scanline = (uint)IVar5.columns;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->szTmp_,IVar5._0_8_ >> 0x30);
      }
    }
  }
  return sVar1 != 0;
}

Assistant:

bool SessionPDU::completeHeader() {
  m_ = lrit::getHeaderMap(buf_);
  if (m_.empty()) {
    return false;
  }

  // File type 0 is image data
  if (ph_.fileType != 0) {
    return true;
  }

  // Check compression flag.
  // If it is anything other than "1" we ignore it.
  auto ish = lrit::getHeader<lrit::ImageStructureHeader>(buf_, m_);
  if (ish.compression != 1) {
    return true;
  }

  // Quote from 5_LRIT_Mission-data.pdf (next to Figure 6)
  //
  //   If the image data is Rice compressed, then the compression
  //   flag, CFLG in the Image Structure Record will be set to a "1".
  //   For uncompressed data, this value will be "0". If the data is
  //   Rice compressed, then a third secondary header must be decoded
  //   to obtain the Rice compression parameters. This is the NOAA
  //   specific Rice Compression Record with a header type equal to
  //   "131" as shown in Figure 6.
  //
  // Therefore, we should now check if this buffer has a Rice
  // compression header and setup the decoder if so.
  //
  if (lrit::hasHeader<lrit::RiceCompressionHeader>(m_)) {
    auto rch = lrit::getHeader<lrit::RiceCompressionHeader>(buf_, m_);
    szParam_.reset(new SZ_com_t);
    szParam_->options_mask = rch.flags | SZ_RAW_OPTION_MASK;
    szParam_->bits_per_pixel = ish.bitsPerPixel;
    szParam_->pixels_per_block = rch.pixelsPerBlock;
    szParam_->pixels_per_scanline = ish.columns;
    szTmp_.resize(szParam_->pixels_per_scanline);
  }

  return true;
}